

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall despot::Parser::ParseTerminalStateTag(Parser *this,TiXmlHandle *handle)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  string *__lhs;
  char *__s;
  reference pvVar6;
  string local_1c8;
  int local_1a8;
  int local_1a4;
  undefined1 local_1a0 [4];
  int i_1;
  vector<int,_std::allocator<int>_> values;
  string local_180;
  allocator<char> local_159;
  string local_158;
  undefined1 local_138 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  instance;
  TiXmlElement *e_Instance;
  undefined1 local_110 [4];
  int id;
  string name;
  int i;
  string local_b8;
  undefined1 local_98 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  TerminalPattern pattern;
  TiXmlElement *e_Table;
  TiXmlHandle local_28;
  TiXmlElement *local_20;
  TiXmlElement *e_Terminal;
  TiXmlHandle *handle_local;
  Parser *this_local;
  
  e_Terminal = (TiXmlElement *)handle;
  handle_local = (TiXmlHandle *)this;
  util::tinyxml::TiXmlHandle::FirstChild((TiXmlHandle *)&e_Table,(char *)handle);
  util::tinyxml::TiXmlHandle::FirstChild(&local_28,(char *)&e_Table);
  local_20 = util::tinyxml::TiXmlHandle::ToElement(&local_28);
  if (local_20 != (TiXmlElement *)0x0) {
    pattern.state_vals._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)GetFirstChildElement(this,local_20,"Table");
    while (pattern.state_vals._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      TerminalPattern::TerminalPattern
                ((TerminalPattern *)
                 &names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      GetFirstChildText_abi_cxx11_
                (&local_b8,this,
                 (TiXmlElement *)pattern.state_vals._M_t._M_impl.super__Rb_tree_header._M_node_count
                 ,"Vars");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&i," ",(allocator<char> *)(name.field_2._M_local_buf + 0xf));
      Tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_98,&local_b8,(string *)&i);
      std::__cxx11::string::~string((string *)&i);
      std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string((string *)&local_b8);
      for (name.field_2._8_4_ = 0; uVar2 = (ulong)(int)name.field_2._8_4_,
          sVar3 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_98), uVar2 < sVar3; name.field_2._8_4_ = name.field_2._8_4_ + 1) {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_98,(long)(int)name.field_2._8_4_);
        std::__cxx11::string::string((string *)local_110,(string *)pvVar4);
        e_Instance._4_4_ = 0;
        while( true ) {
          pvVar5 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::operator[]
                             (&this->curr_state_vars_,(long)e_Instance._4_4_);
          __lhs = NamedVar::name_abi_cxx11_(&pvVar5->super_NamedVar);
          bVar1 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_110);
          if (!bVar1) break;
          e_Instance._4_4_ = e_Instance._4_4_ + 1;
        }
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   &names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict1 *)((long)&e_Instance + 4));
        std::__cxx11::string::~string((string *)local_110);
      }
      instance.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)util::tinyxml::TiXmlNode::FirstChildElement
                              ((TiXmlNode *)
                               pattern.state_vals._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               "Instance");
      while (instance.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        __s = util::tinyxml::TiXmlElement::GetText
                        ((TiXmlElement *)
                         instance.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,__s,&local_159);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_180," ",
                   (allocator<char> *)
                   ((long)&values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        Tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_138,&local_158,&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        std::__cxx11::string::~string((string *)&local_158);
        std::allocator<char>::~allocator(&local_159);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_1a0);
        for (local_1a4 = 0; uVar2 = (ulong)local_1a4,
            sVar3 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_138), uVar2 < sVar3; local_1a4 = local_1a4 + 1) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              &names.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_1a4);
          pvVar5 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::operator[]
                             (&this->curr_state_vars_,(long)*pvVar6);
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_138,(long)local_1a4);
          std::__cxx11::string::string((string *)&local_1c8,(string *)pvVar4);
          local_1a8 = Variable::IndexOf((Variable *)pvVar5,&local_1c8);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_1a0,&local_1a8);
          std::__cxx11::string::~string((string *)&local_1c8);
        }
        std::
        set<std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::insert((set<std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)&pattern.state_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,(value_type *)local_1a0);
        instance.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)util::tinyxml::TiXmlNode::NextSiblingElement
                                ((TiXmlNode *)
                                 instance.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_1a0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_138);
      }
      std::vector<despot::TerminalPattern,_std::allocator<despot::TerminalPattern>_>::push_back
                (&this->terminal_state_patterns_,
                 (value_type *)
                 &names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pattern.state_vals._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)util::tinyxml::TiXmlNode::NextSiblingElement
                             ((TiXmlNode *)
                              pattern.state_vals._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_98);
      TerminalPattern::~TerminalPattern
                ((TerminalPattern *)
                 &names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  return;
}

Assistant:

void Parser::ParseTerminalStateTag(TiXmlHandle& handle) {
	TiXmlElement* e_Terminal = handle.FirstChild("pomdpx").FirstChild(
		"TerminalState").ToElement();

	if (e_Terminal == NULL)
		return;

	// <Table>
	TiXmlElement* e_Table = GetFirstChildElement(e_Terminal, "Table");
	while (e_Table != NULL) {
		TerminalPattern pattern;
		// <Vars>
		vector<string> names = Tokenize(GetFirstChildText(e_Table, "Vars"));
		for (int i = 0; i < names.size(); i++) {
			string name = names[i];
			int id = 0;
			while (curr_state_vars_[id].name() != name)
				id++;
			pattern.state_ids.push_back(id);
		}

		TiXmlElement* e_Instance = e_Table->FirstChildElement("Instance");
		while (e_Instance != NULL) {
			// <Instance>
			vector<string> instance = Tokenize(e_Instance->GetText());
			vector<int> values;
			for (int i = 0; i < instance.size(); i++) {
				values.push_back(
					curr_state_vars_[pattern.state_ids[i]].IndexOf(
						instance[i]));
			}
			pattern.state_vals.insert(values);

			e_Instance = e_Instance->NextSiblingElement();
		}

		terminal_state_patterns_.push_back(pattern);

		e_Table = e_Table->NextSiblingElement();
	}
}